

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O3

void __thiscall inja::LexerConfig::update_open_chars(LexerConfig *this)

{
  long lVar1;
  char cVar2;
  
  ::std::__cxx11::string::_M_replace
            ((ulong)&this->open_chars,0,(char *)(this->open_chars)._M_string_length,0x1816e6);
  cVar2 = (char)&this->open_chars;
  lVar1 = ::std::__cxx11::string::find
                    (cVar2,(ulong)(uint)(int)*(this->line_statement)._M_dataplus._M_p);
  if (lVar1 == -1) {
    ::std::__cxx11::string::push_back(cVar2);
  }
  lVar1 = ::std::__cxx11::string::find
                    (cVar2,(ulong)(uint)(int)*(this->statement_open)._M_dataplus._M_p);
  if (lVar1 == -1) {
    ::std::__cxx11::string::push_back(cVar2);
  }
  lVar1 = ::std::__cxx11::string::find
                    (cVar2,(ulong)(uint)(int)*(this->statement_open_no_lstrip)._M_dataplus._M_p);
  if (lVar1 == -1) {
    ::std::__cxx11::string::push_back(cVar2);
  }
  lVar1 = ::std::__cxx11::string::find
                    (cVar2,(ulong)(uint)(int)*(this->statement_open_force_lstrip)._M_dataplus._M_p);
  if (lVar1 == -1) {
    ::std::__cxx11::string::push_back(cVar2);
  }
  lVar1 = ::std::__cxx11::string::find
                    (cVar2,(ulong)(uint)(int)*(this->expression_open)._M_dataplus._M_p);
  if (lVar1 == -1) {
    ::std::__cxx11::string::push_back(cVar2);
  }
  lVar1 = ::std::__cxx11::string::find
                    (cVar2,(ulong)(uint)(int)*(this->expression_open_force_lstrip)._M_dataplus._M_p)
  ;
  if (lVar1 == -1) {
    ::std::__cxx11::string::push_back(cVar2);
  }
  lVar1 = ::std::__cxx11::string::find
                    (cVar2,(ulong)(uint)(int)*(this->comment_open)._M_dataplus._M_p);
  if (lVar1 == -1) {
    ::std::__cxx11::string::push_back(cVar2);
  }
  lVar1 = ::std::__cxx11::string::find
                    (cVar2,(ulong)(uint)(int)*(this->comment_open_force_lstrip)._M_dataplus._M_p);
  if (lVar1 != -1) {
    return;
  }
  ::std::__cxx11::string::push_back(cVar2);
  return;
}

Assistant:

void update_open_chars() {
    open_chars = "";
    if (open_chars.find(line_statement[0]) == std::string::npos) {
      open_chars += line_statement[0];
    }
    if (open_chars.find(statement_open[0]) == std::string::npos) {
      open_chars += statement_open[0];
    }
    if (open_chars.find(statement_open_no_lstrip[0]) == std::string::npos) {
      open_chars += statement_open_no_lstrip[0];
    }
    if (open_chars.find(statement_open_force_lstrip[0]) == std::string::npos) {
      open_chars += statement_open_force_lstrip[0];
    }
    if (open_chars.find(expression_open[0]) == std::string::npos) {
      open_chars += expression_open[0];
    }
    if (open_chars.find(expression_open_force_lstrip[0]) == std::string::npos) {
      open_chars += expression_open_force_lstrip[0];
    }
    if (open_chars.find(comment_open[0]) == std::string::npos) {
      open_chars += comment_open[0];
    }
    if (open_chars.find(comment_open_force_lstrip[0]) == std::string::npos) {
      open_chars += comment_open_force_lstrip[0];
    }
  }